

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  vector<quadraple,_std::allocator<quadraple>_> token;
  string source;
  FinalParser Parser;
  vector<quadraple,_std::allocator<quadraple>_> vStack_a8;
  vector<quadraple,_std::allocator<quadraple>_> local_90;
  string local_78;
  FinalParser local_58;
  
  ReadProgram_abi_cxx11_();
  if (local_78._M_string_length != 0) {
    Lexical(&vStack_a8,&local_78);
    LLGrammatical(&vStack_a8);
    std::vector<quadraple,_std::allocator<quadraple>_>::vector(&local_90,&vStack_a8);
    FinalParser::FinalParser(&local_58,&local_90);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector(&local_90);
    FinalParser::ProcessDecl(&local_58);
    FinalParser::PrintSymtable(&local_58);
    FinalParser::Start(&local_58);
    FinalParser::~FinalParser(&local_58);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector(&vStack_a8);
  }
  std::__cxx11::string::~string((string *)&local_78);
  return 0;
}

Assistant:

int main() {
    string source(ReadProgram());//source code read from file
    if (source.empty()) {//empty file or failed to open file
        return 0;
    }
    //cout<<source<<endl;

    vector <quadraple> token=Lexical(source);
    LLGrammatical(token);
    //LRGrammatical(token);
    FinalParser Parser(token);
    Parser.ProcessDecl();
    Parser.PrintSymtable();
    Parser.Start();
    //Parser.PrintSymtable();
    return 0;
}